

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

fdb_compact_decision
cb_upt(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
      uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  void *v_out;
  size_t vlen_out;
  timeval __test_begin;
  fdb_doc local_288;
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  if (status != 2) {
    return 0;
  }
  iVar6 = *(int *)((long)ctx + 0x24);
  uVar7 = iVar6 + 1;
  *(uint *)((long)ctx + 0x24) = uVar7;
  if (iVar6 < 5) goto LAB_0010d695;
  iVar6 = *(int *)((long)ctx + 0x20);
  if (iVar6 == 0) {
    local_288.meta = (void *)0x0;
    local_288.body = (void *)0x0;
    local_288.seqnum = 0;
    local_288.offset = 0;
    local_288.size_ondisk = 0;
    local_288.metalen = 0;
    local_288.bodylen = 0;
    local_288.deleted = false;
    local_288._73_3_ = 0;
    local_288.flags = 0;
    local_288.key = doc->key;
    local_288.keylen = doc->keylen;
    fVar2 = fdb_get(*(fdb_kvs_handle **)((long)ctx + 8),&local_288);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x8d2);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x8d2,
                    "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    free(local_288.meta);
    free(local_288.body);
    iVar6 = 1;
    for (uVar8 = 0; (int)uVar8 != 5; uVar8 = (ulong)((int)uVar8 + 1)) {
      sprintf(keybuf,"new%04d",uVar8);
      sprintf(bodybuf,"new_body%04d",uVar8);
      pfVar1 = *(fdb_kvs_handle **)((long)ctx + 8);
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3 + 1,bodybuf,sVar4 + 1);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x8db);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x8db,
                      "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fVar2 = fdb_commit(*ctx,'\0');
      iVar5 = iVar6;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x8dd);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x8dd,
                      "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
        sprintf(keybuf,"new%04d",uVar8);
        sprintf(bodybuf,"new_body%04d",uVar8);
        pfVar1 = *(fdb_kvs_handle **)((long)ctx + 0x10);
        sVar3 = strlen(keybuf);
        fVar2 = fdb_get_kv(pfVar1,keybuf,sVar3 + 1,&v_out,&vlen_out);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x8e6);
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x8e6,
                        "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
        fdb_free_block(v_out);
      }
      iVar6 = iVar6 + 1;
    }
    *(undefined4 *)((long)ctx + 0x20) = 1;
    if (*(int *)((long)ctx + 0x24) < 0xb) goto LAB_0010d695;
LAB_0010d4d2:
    uVar8 = 0;
    while ((int)uVar8 != 2) {
      sprintf(keybuf,"xxx%d",uVar8);
      sprintf(bodybuf,"xxxvalue%d",uVar8);
      pfVar1 = *(fdb_kvs_handle **)((long)ctx + 8);
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3 + 1,bodybuf,sVar4 + 1);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x8f3);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x8f3,
                      "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fVar2 = fdb_commit(*ctx,'\0');
      uVar8 = (ulong)((int)uVar8 + 1);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x8f5);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x8f5,
                      "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    *(undefined4 *)((long)ctx + 0x20) = 2;
    if (*(int *)((long)ctx + 0x24) != 0x11) goto LAB_0010d695;
  }
  else {
    if (uVar7 < 0xb) goto LAB_0010d695;
    if (iVar6 == 1) goto LAB_0010d4d2;
    if (iVar6 != 2 || uVar7 != 0x11) goto LAB_0010d695;
  }
  uVar7 = 0;
  while (uVar7 != 2) {
    sprintf(keybuf,"zzz%d",(ulong)uVar7);
    sprintf(bodybuf,"zzzvalue%d",(ulong)uVar7);
    pfVar1 = *(fdb_kvs_handle **)((long)ctx + 8);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3 + 1,bodybuf,sVar4 + 1);
    uVar7 = uVar7 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x901);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x901,
                    "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
  }
  *(undefined4 *)((long)ctx + 0x20) = 3;
LAB_0010d695:
  if (*(short *)kv_name == 0x6264) {
    return 0;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","db",kv_name,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x905);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x905,
                "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
               );
}

Assistant:

static fdb_compact_decision cb_upt(fdb_file_handle *fhandle,
                                   fdb_compaction_status status,
                                   const char *kv_name,
                                   fdb_doc *doc, uint64_t old_offset,
                                   uint64_t new_offset,
                                   void *ctx)
{
    TEST_INIT();
    struct cb_upt_args *args = (struct cb_upt_args *)ctx;
    (void) fhandle;
    (void) doc;
    (void) old_offset;
    (void) new_offset;

    if (status == FDB_CS_MOVE_DOC) {
        int i, j;
        int n = 10;
        char keybuf[256], bodybuf[256];
        char keystr[] = "new%04d";
        char valuestr[] = "new_body%04d";
        fdb_status s;
        args->nmoves++;
        if (args->nmoves > n/2 && !args->done) {
            // verify if the key is stripped off its prefix
            fdb_doc tdoc;
            memset(&tdoc, 0, sizeof(fdb_doc));
            tdoc.key = doc->key;
            tdoc.keylen = doc->keylen;
            s = fdb_get(args->handle, &tdoc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            free(tdoc.meta);
            free(tdoc.body);
            // insert new docs
            for (i=0;i<n/2;++i){
                sprintf(keybuf, keystr, i);
                sprintf(bodybuf, valuestr, i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);

                for (j=0; j<=i; ++j){
                    void *v_out;
                    size_t vlen_out;
                    sprintf(keybuf, keystr, i);
                    sprintf(bodybuf, valuestr, i);
                    s = fdb_get_kv(args->handle2, keybuf, strlen(keybuf)+1,
                        &v_out, &vlen_out);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    fdb_free_block(v_out);
                }
            }
            args->done = 1;
        }
        if (args->nmoves > n && args->done == 1) {
            // the first phase is done. insert new docs.
            for (i=0;i<2;++i){
                sprintf(keybuf, "xxx%d", i);
                sprintf(bodybuf, "xxxvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 2;
        }
        if (args->nmoves == (n*3/2 + 2) && args->done == 2) {
            // during the second-second phase,
            // insert new docs, and do not commit.
            for (i=0;i<2;++i){
                sprintf(keybuf, "zzz%d", i);
                sprintf(bodybuf, "zzzvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 3;
        }
        TEST_CMP(kv_name, "db", 2);
    }

    return 0;
}